

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

int InsertionSort(EdgeTableEntry *AET)

{
  _EdgeTableEntry *p_Var1;
  _EdgeTableEntry *p_Var2;
  int iVar3;
  _EdgeTableEntry *p_Var4;
  EdgeTableEntry *pEVar5;
  EdgeTableEntry *pEVar6;
  
  iVar3 = 0;
  while (pEVar6 = AET, pEVar6 != (EdgeTableEntry *)0x0) {
    p_Var1 = pEVar6;
    do {
      pEVar5 = p_Var1;
      p_Var1 = pEVar5->back;
    } while ((pEVar6->bres).minor_axis < (p_Var1->bres).minor_axis);
    AET = pEVar6->next;
    if (pEVar5 != pEVar6) {
      p_Var2 = pEVar6->back;
      p_Var2->next = AET;
      p_Var4 = p_Var1;
      if (AET != (_EdgeTableEntry *)0x0) {
        AET->back = p_Var2;
        p_Var4 = pEVar5->back;
      }
      pEVar6->next = pEVar5;
      p_Var4->next = pEVar6;
      pEVar5->back = pEVar6;
      pEVar6->back = p_Var1;
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

static int InsertionSort(EdgeTableEntry *AET)
{
    EdgeTableEntry *pETEchase;
    EdgeTableEntry *pETEinsert;
    EdgeTableEntry *pETEchaseBackTMP;
    int changed = 0;

    AET = AET->next;
    while (AET) {
        pETEinsert = AET;
        pETEchase = AET;
        while (pETEchase->back->bres.minor_axis > AET->bres.minor_axis)
            pETEchase = pETEchase->back;

        AET = AET->next;
        if (pETEchase != pETEinsert) {
            pETEchaseBackTMP = pETEchase->back;
            pETEinsert->back->next = AET;
            if (AET)
                AET->back = pETEinsert->back;
            pETEinsert->next = pETEchase;
            pETEchase->back->next = pETEinsert;
            pETEchase->back = pETEinsert;
            pETEinsert->back = pETEchaseBackTMP;
            changed = 1;
        }
    }
    return changed;
}